

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVArhsQ(sunrealtype t,N_Vector yB,N_Vector qBdot,void *cvode_mem)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  
  lVar1 = *(long *)((long)cvode_mem + 0xa70);
  lVar2 = *(long *)(lVar1 + 0x40);
  if (*(int *)(lVar1 + 0xbc) == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(undefined8 *)(lVar1 + 0x200);
  }
  (**(code **)(lVar1 + 0xa8))(cvode_mem,*(undefined8 *)(lVar1 + 0x1f8),uVar4);
  if (*(int *)(lVar2 + 0x1c) != 0) {
    iVar3 = (**(code **)(lVar2 + 0x38))
                      (t,*(undefined8 *)(lVar1 + 0x1f8),*(undefined8 *)(lVar1 + 0x200),yB,qBdot,
                       *(undefined8 *)(lVar2 + 0x40));
    return iVar3;
  }
  iVar3 = (**(code **)(lVar2 + 0x30))
                    (t,*(undefined8 *)(lVar1 + 0x1f8),yB,qBdot,*(undefined8 *)(lVar2 + 0x40));
  return iVar3;
}

Assistant:

static int CVArhsQ(sunrealtype t, N_Vector yB, N_Vector qBdot, void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  /* int flag; */
  int retval;

  cv_mem = (CVodeMem)cvode_mem;

  ca_mem = cv_mem->cv_adj_mem;

  cvB_mem = ca_mem->ca_bckpbCrt;

  /* Get forward solution from interpolation */

  if (ca_mem->ca_IMinterpSensi)
  {
    /* flag = */ ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, ca_mem->ca_yStmp);
  }
  else
  { /* flag = */
    ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  }

  /* Call the user's RHS function */

  if (cvB_mem->cv_fQ_withSensi)
  {
    retval = (cvB_mem->cv_fQs)(t, ca_mem->ca_ytmp, ca_mem->ca_yStmp, yB, qBdot,
                               cvB_mem->cv_user_data);
  }
  else
  {
    retval = (cvB_mem->cv_fQ)(t, ca_mem->ca_ytmp, yB, qBdot,
                              cvB_mem->cv_user_data);
  }

  return (retval);
}